

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X86ATTInstPrinter.c
# Opt level: O3

void printMemReference(MCInst *MI,uint Op,SStream *O)

{
  uint8_t *puVar1;
  byte bVar2;
  cs_detail *pcVar3;
  cs_struct *h;
  _Bool _Var4;
  uint uVar5;
  MCOperand *op;
  MCOperand *pMVar6;
  int64_t iVar7;
  MCOperand *op_00;
  MCOperand *op_01;
  ulong imm;
  bool bVar8;
  uint8_t access [6];
  uint8_t local_36 [6];
  
  op = MCInst_getOperand(MI,Op);
  pMVar6 = MCInst_getOperand(MI,Op + 1);
  iVar7 = MCOperand_getImm(pMVar6);
  pMVar6 = MCInst_getOperand(MI,Op + 2);
  op_00 = MCInst_getOperand(MI,Op + 3);
  op_01 = MCInst_getOperand(MI,Op + 4);
  if (MI->csh->detail != CS_OPT_OFF) {
    pcVar3 = MI->flat_insn->detail;
    puVar1 = pcVar3->groups + (ulong)((uint)(pcVar3->field_6).x86.op_count * 0x30) + 0x55;
    puVar1[0] = '\x03';
    puVar1[1] = '\0';
    puVar1[2] = '\0';
    puVar1[3] = '\0';
    pcVar3 = MI->flat_insn->detail;
    pcVar3->groups[(ulong)((uint)(pcVar3->field_6).x86.op_count * 0x30) + 0x75] = MI->x86opsize;
    pcVar3 = MI->flat_insn->detail;
    puVar1 = pcVar3->groups + (ulong)((uint)(pcVar3->field_6).x86.op_count * 0x30) + 0x5d;
    puVar1[0] = '\0';
    puVar1[1] = '\0';
    puVar1[2] = '\0';
    puVar1[3] = '\0';
    uVar5 = MCOperand_getReg(op);
    pcVar3 = MI->flat_insn->detail;
    *(uint *)(pcVar3->groups + (ulong)((uint)(pcVar3->field_6).x86.op_count * 0x30) + 0x61) = uVar5;
    uVar5 = MCOperand_getReg(pMVar6);
    pcVar3 = MI->flat_insn->detail;
    *(uint *)(pcVar3->groups + (ulong)((uint)(pcVar3->field_6).x86.op_count * 0x30) + 0x65) = uVar5;
    pcVar3 = MI->flat_insn->detail;
    *(int *)(pcVar3->groups + (ulong)((uint)(pcVar3->field_6).x86.op_count * 0x30) + 0x69) =
         (int)iVar7;
    pcVar3 = MI->flat_insn->detail;
    puVar1 = pcVar3->groups + (ulong)((uint)(pcVar3->field_6).x86.op_count * 0x30) + 0x6d;
    puVar1[0] = '\0';
    puVar1[1] = '\0';
    puVar1[2] = '\0';
    puVar1[3] = '\0';
    puVar1[4] = '\0';
    puVar1[5] = '\0';
    puVar1[6] = '\0';
    puVar1[7] = '\0';
    h = MI->csh;
    uVar5 = MCInst_getOpcode(MI);
    get_op_access(h,uVar5,local_36,&(MI->flat_insn->detail->field_6).x86.field_15.eflags);
    pcVar3 = MI->flat_insn->detail;
    bVar2 = (pcVar3->field_6).x86.op_count;
    pcVar3->groups[(ulong)((uint)bVar2 * 0x30) + 0x76] = local_36[bVar2];
  }
  uVar5 = MCOperand_getReg(op_01);
  if (uVar5 != 0) {
    _printOperand(MI,Op + 4,O);
    if (MI->csh->detail != CS_OPT_OFF) {
      pcVar3 = MI->flat_insn->detail;
      *(uint *)(pcVar3->groups + (ulong)((uint)(pcVar3->field_6).x86.op_count * 0x30) + 0x5d) =
           uVar5;
    }
    SStream_concat0(O,":");
  }
  SStream_concat0(O,"[");
  uVar5 = MCOperand_getReg(op);
  bVar8 = uVar5 != 0;
  if (bVar8) {
    _printOperand(MI,Op,O);
  }
  uVar5 = MCOperand_getReg(pMVar6);
  if (uVar5 != 0) {
    if (bVar8) {
      SStream_concat0(O," + ");
    }
    _printOperand(MI,Op + 2,O);
    bVar8 = true;
    if (iVar7 != 1) {
      SStream_concat(O,"*%u");
    }
  }
  _Var4 = MCOperand_isImm(op_00);
  if (_Var4) {
    imm = MCOperand_getImm(op_00);
    if (MI->csh->detail != CS_OPT_OFF) {
      pcVar3 = MI->flat_insn->detail;
      *(ulong *)(pcVar3->groups + (ulong)((uint)(pcVar3->field_6).x86.op_count * 0x30) + 0x6d) = imm
      ;
    }
    if (imm == 0) {
      if (!bVar8) {
        SStream_concat0(O,"0");
      }
    }
    else {
      if (bVar8) {
        if ((long)imm < 0) {
          SStream_concat0(O," - ");
          imm = -imm;
        }
        else {
          SStream_concat0(O," + ");
        }
      }
      else if ((long)imm < 0) {
        imm = arch_masks[MI->csh->mode] & imm;
      }
      printImm(MI,O,imm,true);
    }
  }
  SStream_concat0(O,"]");
  if (MI->csh->detail != CS_OPT_OFF) {
    puVar1 = &(MI->flat_insn->detail->field_6).x86.op_count;
    *puVar1 = *puVar1 + '\x01';
  }
  if (MI->op1_size == '\0') {
    MI->op1_size = MI->x86opsize;
  }
  return;
}

Assistant:

static void printMemReference(MCInst *MI, unsigned Op, SStream *O)
{
	MCOperand *BaseReg  = MCInst_getOperand(MI, Op + X86_AddrBaseReg);
	MCOperand *IndexReg  = MCInst_getOperand(MI, Op + X86_AddrIndexReg);
	MCOperand *DispSpec = MCInst_getOperand(MI, Op + X86_AddrDisp);
	MCOperand *SegReg = MCInst_getOperand(MI, Op + X86_AddrSegmentReg);
	uint64_t ScaleVal;
	int segreg;
	int64_t DispVal = 1;

	if (MI->csh->detail) {
		uint8_t access[6];

		MI->flat_insn->detail->x86.operands[MI->flat_insn->detail->x86.op_count].type = X86_OP_MEM;
		MI->flat_insn->detail->x86.operands[MI->flat_insn->detail->x86.op_count].size = MI->x86opsize;
		MI->flat_insn->detail->x86.operands[MI->flat_insn->detail->x86.op_count].mem.segment = X86_REG_INVALID;
		MI->flat_insn->detail->x86.operands[MI->flat_insn->detail->x86.op_count].mem.base = MCOperand_getReg(BaseReg);
		MI->flat_insn->detail->x86.operands[MI->flat_insn->detail->x86.op_count].mem.index = MCOperand_getReg(IndexReg);
		MI->flat_insn->detail->x86.operands[MI->flat_insn->detail->x86.op_count].mem.scale = 1;
		MI->flat_insn->detail->x86.operands[MI->flat_insn->detail->x86.op_count].mem.disp = 0;

		get_op_access(MI->csh, MCInst_getOpcode(MI), access, &MI->flat_insn->detail->x86.eflags);
		MI->flat_insn->detail->x86.operands[MI->flat_insn->detail->x86.op_count].access = access[MI->flat_insn->detail->x86.op_count];
	}

	// If this has a segment register, print it.
	segreg = MCOperand_getReg(SegReg);
	if (segreg) {
		_printOperand(MI, Op + X86_AddrSegmentReg, O);
		if (MI->csh->detail) {
			MI->flat_insn->detail->x86.operands[MI->flat_insn->detail->x86.op_count].mem.segment = segreg;
		}

		SStream_concat0(O, ":");
	}

	if (MCOperand_isImm(DispSpec)) {
		DispVal = MCOperand_getImm(DispSpec);
		if (MI->csh->detail)
			MI->flat_insn->detail->x86.operands[MI->flat_insn->detail->x86.op_count].mem.disp = DispVal;
		if (DispVal) {
			if (MCOperand_getReg(IndexReg) || MCOperand_getReg(BaseReg)) {
				printInt64(O, DispVal);
			} else {
				// only immediate as address of memory
				if (DispVal < 0) {
					SStream_concat(O, "0x%"PRIx64, arch_masks[MI->csh->mode] & DispVal);
				} else {
					if (DispVal > HEX_THRESHOLD)
						SStream_concat(O, "0x%"PRIx64, DispVal);
					else
						SStream_concat(O, "%"PRIu64, DispVal);
				}
			}
		} else {
		}
	}

	if (MCOperand_getReg(IndexReg) || MCOperand_getReg(BaseReg)) {
		SStream_concat0(O, "(");

		if (MCOperand_getReg(BaseReg))
			_printOperand(MI, Op + X86_AddrBaseReg, O);

		if (MCOperand_getReg(IndexReg)) {
			SStream_concat0(O, ", ");
			_printOperand(MI, Op + X86_AddrIndexReg, O);
			ScaleVal = MCOperand_getImm(MCInst_getOperand(MI, Op + X86_AddrScaleAmt));
			if (MI->csh->detail)
				MI->flat_insn->detail->x86.operands[MI->flat_insn->detail->x86.op_count].mem.scale = (int)ScaleVal;
			if (ScaleVal != 1) {
				SStream_concat(O, ", %u", ScaleVal);
			}
		}
		SStream_concat0(O, ")");
	} else {
		if (!DispVal)
			SStream_concat0(O, "0");
	}

	if (MI->csh->detail)
		MI->flat_insn->detail->x86.op_count++;
}